

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<TPZFlopCounter>::Subst_Backward
          (TPZMatrix<TPZFlopCounter> *this,TPZFMatrix<TPZFlopCounter> *B)

{
  TPZFlopCounter *pTVar1;
  TPZBaseMatrix *pTVar2;
  int64_t iVar3;
  long lVar4;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  int64_t i;
  TPZFlopCounter sum;
  int64_t c;
  TPZFlopCounter pivot;
  int64_t r;
  TPZFlopCounter *in_stack_ffffffffffffff60;
  TPZFlopCounter *in_stack_ffffffffffffff68;
  REAL local_68 [2];
  undefined8 local_58;
  TPZFlopCounter local_50;
  long local_48;
  double local_40;
  TPZFlopCounter local_38;
  TPZFlopCounter *local_30;
  undefined8 local_28;
  TPZFlopCounter *local_20;
  TPZBaseMatrix *local_18;
  int local_4;
  
  local_18 = in_RSI;
  iVar3 = TPZBaseMatrix::Rows(in_RSI);
  lVar4 = (**(code **)(*in_RDI + 0x60))();
  if (((iVar3 == lVar4) && ((char)in_RDI[3] != '\0')) && ((char)in_RDI[3] == '\x03')) {
    local_20 = (TPZFlopCounter *)(**(code **)(*in_RDI + 0x60))();
    while (local_20 = (TPZFlopCounter *)((long)&local_20[-1].fVal + 7), -1 < (long)local_20) {
      local_28 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_20,local_20);
      for (local_30 = (TPZFlopCounter *)0x0; pTVar1 = local_30,
          iVar3 = TPZBaseMatrix::Cols(local_18), (long)pTVar1 < iVar3;
          local_30 = (TPZFlopCounter *)((long)&local_30->fVal + 1)) {
        local_40 = 0.0;
        TPZFlopCounter::TPZFlopCounter(&local_38,&local_40);
        local_48 = (**(code **)(*in_RDI + 0x60))();
        while (pTVar2 = local_18, local_48 = local_48 + -1, (long)local_20 < local_48) {
          local_58 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_20,local_48);
          (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_18,local_48,local_30);
          local_50 = TPZFlopCounter::operator*(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
          TPZFlopCounter::operator+=(&local_38,&local_50);
        }
        in_stack_ffffffffffffff60 = local_20;
        in_stack_ffffffffffffff68 = local_30;
        (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_18,local_20,local_30);
        TPZFlopCounter::operator-(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        local_68[0] = (REAL)TPZFlopCounter::operator/
                                      (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (pTVar2,in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,local_68);
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const {
	
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky) return( 0 );
	for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
			//
			TVar sum = 0.0;
			for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
        }
    }
    return( 1 );
}